

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O2

void m68k_op_add_16_er_ai(void)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  
  uVar5 = (ulong)(m68ki_cpu.ir >> 7 & 0x1c);
  uVar3 = OPER_AY_AI_16();
  uVar2 = *(uint *)((long)m68ki_cpu.dar + uVar5);
  uVar4 = uVar2 & 0xffff;
  uVar1 = uVar4 + uVar3;
  m68ki_cpu.x_flag = uVar1 >> 8;
  m68ki_cpu.v_flag = ((uVar4 ^ uVar1) & (uVar3 ^ uVar1)) >> 8;
  m68ki_cpu.not_z_flag = uVar1 & 0xffff;
  m68ki_cpu.n_flag = m68ki_cpu.x_flag;
  m68ki_cpu.c_flag = m68ki_cpu.x_flag;
  *(uint *)((long)m68ki_cpu.dar + uVar5) = uVar2 & 0xffff0000 | m68ki_cpu.not_z_flag;
  return;
}

Assistant:

static void m68k_op_add_16_er_ai(void)
{
	uint* r_dst = &DX;
	uint src = OPER_AY_AI_16();
	uint dst = MASK_OUT_ABOVE_16(*r_dst);
	uint res = src + dst;

	FLAG_N = NFLAG_16(res);
	FLAG_V = VFLAG_ADD_16(src, dst, res);
	FLAG_X = FLAG_C = CFLAG_16(res);
	FLAG_Z = MASK_OUT_ABOVE_16(res);

	*r_dst = MASK_OUT_BELOW_16(*r_dst) | FLAG_Z;
}